

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vanilla_utils.cpp
# Opt level: O0

cornelich * __thiscall
cornelich::make_file
          (cornelich *this,string *base_path,string *cycle_string,string *file_name,bool append)

{
  bool bVar1;
  string *psVar2;
  byte local_139;
  path local_128;
  undefined1 local_108 [8];
  path file;
  path local_e0;
  path local_c0;
  path local_90;
  path local_70;
  undefined1 local_50 [8];
  path dir;
  bool append_local;
  string *file_name_local;
  string *cycle_string_local;
  string *base_path_local;
  
  dir._31_1_ = append;
  boost::filesystem::path::path(&local_70,base_path);
  boost::filesystem::path::path(&local_90,cycle_string);
  boost::filesystem::operator/((path *)local_50,&local_70,&local_90);
  boost::filesystem::path::~path(&local_90);
  boost::filesystem::path::~path(&local_70);
  file._31_1_ = 0;
  file._30_1_ = 0;
  local_139 = 0;
  if ((dir._31_1_ & 1) == 0) {
    boost::filesystem::path::path(&local_e0,file_name);
    file._31_1_ = 1;
    boost::filesystem::operator/(&local_c0,(path *)local_50,&local_e0);
    file._30_1_ = 1;
    bVar1 = boost::filesystem::exists(&local_c0);
    local_139 = bVar1 ^ 0xff;
  }
  if ((file._30_1_ & 1) != 0) {
    boost::filesystem::path::~path(&local_c0);
  }
  if ((file._31_1_ & 1) != 0) {
    boost::filesystem::path::~path(&local_e0);
  }
  if ((local_139 & 1) == 0) {
    bVar1 = boost::filesystem::is_directory((path *)local_50);
    if (!bVar1) {
      boost::filesystem::create_directories((path *)local_50);
    }
    boost::filesystem::path::path(&local_128,file_name);
    boost::filesystem::operator/((path *)local_108,(path *)local_50,&local_128);
    boost::filesystem::path::~path(&local_128);
    bVar1 = boost::filesystem::exists((path *)local_108);
    if ((bVar1) || ((dir._31_1_ & 1) != 0)) {
      psVar2 = boost::filesystem::path::string_abi_cxx11_((path *)local_108);
      std::__cxx11::string::string((string *)this,(string *)psVar2);
    }
    else {
      std::__cxx11::string::string((string *)this);
    }
    file._24_4_ = 1;
    boost::filesystem::path::~path((path *)local_108);
  }
  else {
    std::__cxx11::string::string((string *)this);
    file._24_4_ = 1;
  }
  boost::filesystem::path::~path((path *)local_50);
  return this;
}

Assistant:

std::string make_file(const std::string & base_path,
                      const std::string & cycle_string,
                      const std::string & file_name,
                      bool append)
{
    const auto dir = fs::path(base_path) / cycle_string;
    if(!append && !fs::exists(dir / file_name))
    {
        return {};
    }

    if(!fs::is_directory(dir))
    {
        fs::create_directories(dir);
    }

    const auto file = dir / file_name;
    if(fs::exists(file))
    {
        // "File exists:" << file;
    }
    else if(append)
    {
        // "File does not exist: " << file;
    }
    else
    {
        return {};
    }
    return file.string();
}